

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_dbg.c
# Opt level: O0

int tool_debug_cb(CURL *handle,curl_infotype type,uchar *data,size_t size,void *userdata)

{
  GlobalConfig *config_00;
  int iVar1;
  time_t tVar2;
  FILE *pFVar3;
  timeval tVar4;
  long local_b0;
  size_t st;
  size_t i;
  __suseconds_t local_98;
  long local_90;
  time_t secs;
  char timebuf [20];
  tm *now;
  timeval tv;
  char *text;
  FILE *output;
  GlobalConfig *config;
  OperationConfig *operation;
  void *userdata_local;
  size_t size_local;
  uchar *data_local;
  curl_infotype type_local;
  CURL *handle_local;
  
  config_00 = *(GlobalConfig **)((long)userdata + 0x3b8);
  text = (char *)config_00->errors;
  if ((config_00->tracetime & 1U) == 0) {
    secs._0_1_ = 0;
  }
  else {
    tVar4 = tool_tvnow();
    i = tVar4.tv_sec;
    local_98 = tVar4.tv_usec;
    if (tool_debug_cb::known_offset == 0) {
      tVar2 = time((time_t *)0x0);
      tool_debug_cb::epoch_offset = tVar2 - i;
      tool_debug_cb::known_offset = 1;
    }
    local_90 = tool_debug_cb::epoch_offset + i;
    register0x00000000 = localtime(&local_90);
    curl_msnprintf(&secs,0x14,"%02d:%02d:%02d.%06ld ",register0x00000000->tm_hour,
                   register0x00000000->tm_min,register0x00000000->tm_sec,local_98);
  }
  if (config_00->trace_stream == (FILE *)0x0) {
    iVar1 = curl_strequal("-",config_00->trace_dump);
    if (iVar1 == 0) {
      iVar1 = curl_strequal("%",config_00->trace_dump);
      if (iVar1 == 0) {
        pFVar3 = fopen64(config_00->trace_dump,"w");
        config_00->trace_stream = (FILE *)pFVar3;
        config_00->trace_fopened = true;
      }
      else {
        config_00->trace_stream = config_00->errors;
      }
    }
    else {
      config_00->trace_stream = _stdout;
    }
  }
  if (config_00->trace_stream != (FILE *)0x0) {
    text = (char *)config_00->trace_stream;
  }
  if (text == (char *)0x0) {
    warnf(config_00,"Failed to create/open output");
    return 0;
  }
  if (config_00->tracetype == TRACE_PLAIN) {
    local_b0 = 0;
    if (type < CURLINFO_HEADER_OUT) {
      if ((tool_debug_cb::newl & 1U) == 0) {
        curl_mfprintf(text,"%s%s ",&secs,tool_debug_cb::s_infotype[type]);
      }
      fwrite(data,size,1,(FILE *)text);
      tool_debug_cb::newl = false;
      if (size != 0) {
        tool_debug_cb::newl = data[size - 1] != '\n';
      }
      tool_debug_cb::traced_data = false;
      return 0;
    }
    if (type == CURLINFO_HEADER_OUT) {
      if (size != 0) {
        for (st = 0; st < size - 1; st = st + 1) {
          if (data[st] == '\n') {
            if ((tool_debug_cb::newl & 1U) == 0) {
              curl_mfprintf(text,"%s%s ",&secs,">");
            }
            fwrite(data + local_b0,(st - local_b0) + 1,1,(FILE *)text);
            local_b0 = st + 1;
            tool_debug_cb::newl = false;
          }
        }
        if ((tool_debug_cb::newl & 1U) == 0) {
          curl_mfprintf(text,"%s%s ",&secs,">");
        }
        fwrite(data + local_b0,(st - local_b0) + 1,1,(FILE *)text);
      }
      tool_debug_cb::newl = false;
      if (size != 0) {
        tool_debug_cb::newl = data[size - 1] != '\n';
      }
      tool_debug_cb::traced_data = false;
      return 0;
    }
    if (3 < type - CURLINFO_DATA_IN) {
      tool_debug_cb::newl = false;
      tool_debug_cb::traced_data = false;
      return 0;
    }
    if ((tool_debug_cb::traced_data & 1U) != 0) {
      return 0;
    }
    if ((config_00->isatty & 1U) != 0) {
      if (text == _stderr) {
        return 0;
      }
      if ((FILE *)text == _stdout) {
        return 0;
      }
    }
    if ((tool_debug_cb::newl & 1U) == 0) {
      curl_mfprintf(text,"%s%s ",&secs,tool_debug_cb::s_infotype[type]);
    }
    curl_mfprintf(text,"[%zd bytes data]\n",size);
    tool_debug_cb::newl = false;
    tool_debug_cb::traced_data = true;
    return 0;
  }
  switch(type) {
  case CURLINFO_TEXT:
    curl_mfprintf(text,"%s== Info: %s",&secs,data);
    return 0;
  case CURLINFO_HEADER_IN:
    tv.tv_usec = (__suseconds_t)anon_var_dwarf_318;
    break;
  case CURLINFO_HEADER_OUT:
    tv.tv_usec = (__suseconds_t)anon_var_dwarf_2ec;
    break;
  case CURLINFO_DATA_IN:
    tv.tv_usec = (__suseconds_t)anon_var_dwarf_322;
    break;
  case CURLINFO_DATA_OUT:
    tv.tv_usec = (__suseconds_t)anon_var_dwarf_302;
    break;
  case CURLINFO_SSL_DATA_IN:
    tv.tv_usec = (__suseconds_t)anon_var_dwarf_32c;
    break;
  case CURLINFO_SSL_DATA_OUT:
    tv.tv_usec = (__suseconds_t)anon_var_dwarf_342;
    break;
  default:
    goto switchD_00108cd1_default;
  }
  dump((char *)&secs,(char *)tv.tv_usec,(FILE *)text,data,size,config_00->tracetype,type);
switchD_00108cd1_default:
  return 0;
}

Assistant:

int tool_debug_cb(CURL *handle, curl_infotype type,
                  unsigned char *data, size_t size,
                  void *userdata)
{
  struct OperationConfig *operation = userdata;
  struct GlobalConfig *config = operation->global;
  FILE *output = config->errors;
  const char *text;
  struct timeval tv;
  struct tm *now;
  char timebuf[20];
  time_t secs;
  static time_t epoch_offset;
  static int    known_offset;

  (void)handle; /* not used */

  if(config->tracetime) {
    tv = tvnow();
    if(!known_offset) {
      epoch_offset = time(NULL) - tv.tv_sec;
      known_offset = 1;
    }
    secs = epoch_offset + tv.tv_sec;
    now = localtime(&secs);  /* not thread safe but we don't care */
    snprintf(timebuf, sizeof(timebuf), "%02d:%02d:%02d.%06ld ",
             now->tm_hour, now->tm_min, now->tm_sec, (long)tv.tv_usec);
  }
  else
    timebuf[0] = 0;

  if(!config->trace_stream) {
    /* open for append */
    if(curlx_strequal("-", config->trace_dump))
      config->trace_stream = stdout;
    else if(curlx_strequal("%", config->trace_dump))
      /* Ok, this is somewhat hackish but we do it undocumented for now */
      config->trace_stream = config->errors;  /* aka stderr */
    else {
      config->trace_stream = fopen(config->trace_dump, FOPEN_WRITETEXT);
      config->trace_fopened = TRUE;
    }
  }

  if(config->trace_stream)
    output = config->trace_stream;

  if(!output) {
    warnf(config, "Failed to create/open output");
    return 0;
  }

  if(config->tracetype == TRACE_PLAIN) {
    /*
     * This is the trace look that is similar to what libcurl makes on its
     * own.
     */
    static const char * const s_infotype[] = {
      "*", "<", ">", "{", "}", "{", "}"
    };
    size_t i;
    size_t st = 0;
    static bool newl = FALSE;
    static bool traced_data = FALSE;

    switch(type) {
    case CURLINFO_HEADER_OUT:
      if(size > 0) {
        for(i = 0; i < size - 1; i++) {
          if(data[i] == '\n') { /* LF */
            if(!newl) {
              fprintf(output, "%s%s ", timebuf, s_infotype[type]);
            }
            (void)fwrite(data + st, i - st + 1, 1, output);
            st = i + 1;
            newl = FALSE;
          }
        }
        if(!newl)
          fprintf(output, "%s%s ", timebuf, s_infotype[type]);
        (void)fwrite(data + st, i - st + 1, 1, output);
      }
      newl = (size && (data[size - 1] != '\n')) ? TRUE : FALSE;
      traced_data = FALSE;
      break;
    case CURLINFO_TEXT:
    case CURLINFO_HEADER_IN:
      if(!newl)
        fprintf(output, "%s%s ", timebuf, s_infotype[type]);
      (void)fwrite(data, size, 1, output);
      newl = (size && (data[size - 1] != '\n')) ? TRUE : FALSE;
      traced_data = FALSE;
      break;
    case CURLINFO_DATA_OUT:
    case CURLINFO_DATA_IN:
    case CURLINFO_SSL_DATA_IN:
    case CURLINFO_SSL_DATA_OUT:
      if(!traced_data) {
        /* if the data is output to a tty and we're sending this debug trace
           to stderr or stdout, we don't display the alert about the data not
           being shown as the data _is_ shown then just not via this
           function */
        if(!config->isatty || ((output != stderr) && (output != stdout))) {
          if(!newl)
            fprintf(output, "%s%s ", timebuf, s_infotype[type]);
          fprintf(output, "[%zd bytes data]\n", size);
          newl = FALSE;
          traced_data = TRUE;
        }
      }
      break;
    default: /* nada */
      newl = FALSE;
      traced_data = FALSE;
      break;
    }

    return 0;
  }

#ifdef CURL_DOES_CONVERSIONS
  /* Special processing is needed for CURLINFO_HEADER_OUT blocks
   * if they contain both headers and data (separated by CRLFCRLF).
   * We dump the header text and then switch type to CURLINFO_DATA_OUT.
   */
  if((type == CURLINFO_HEADER_OUT) && (size > 4)) {
    size_t i;
    for(i = 0; i < size - 4; i++) {
      if(memcmp(&data[i], "\r\n\r\n", 4) == 0) {
        /* dump everything through the CRLFCRLF as a sent header */
        text = "=> Send header";
        dump(timebuf, text, output, data, i + 4, config->tracetype, type);
        data += i + 3;
        size -= i + 4;
        type = CURLINFO_DATA_OUT;
        data += 1;
        break;
      }
    }
  }
#endif /* CURL_DOES_CONVERSIONS */

  switch (type) {
  case CURLINFO_TEXT:
    fprintf(output, "%s== Info: %s", timebuf, data);
  default: /* in case a new one is introduced to shock us */
    return 0;

  case CURLINFO_HEADER_OUT:
    text = "=> Send header";
    break;
  case CURLINFO_DATA_OUT:
    text = "=> Send data";
    break;
  case CURLINFO_HEADER_IN:
    text = "<= Recv header";
    break;
  case CURLINFO_DATA_IN:
    text = "<= Recv data";
    break;
  case CURLINFO_SSL_DATA_IN:
    text = "<= Recv SSL data";
    break;
  case CURLINFO_SSL_DATA_OUT:
    text = "=> Send SSL data";
    break;
  }

  dump(timebuf, text, output, data, size, config->tracetype, type);
  return 0;
}